

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O1

void ourWriteOut(char *writeinfo,per_transfer *per,CURLcode per_result)

{
  char cVar1;
  byte bVar2;
  writeoutid wVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  char *pcVar7;
  undefined8 *puVar8;
  int __c;
  int iVar9;
  FILE *__stream;
  writeoutvar *pwVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  
  if ((writeinfo != (char *)0x0) && (cVar6 = *writeinfo, cVar6 != '\0')) {
    bVar12 = false;
    __stream = _stdout;
    do {
      if (cVar6 == '\\') {
        bVar2 = writeinfo[1];
        if (bVar2 < 0x72) {
          if (bVar2 == 0) goto LAB_0011cabd;
          if (bVar2 != 0x6e) {
LAB_0011cade:
            __c = 0x5c;
            goto LAB_0011cae3;
          }
          iVar9 = 10;
        }
        else if (bVar2 == 0x72) {
          iVar9 = 0xd;
        }
        else {
          if (bVar2 != 0x74) goto LAB_0011cade;
          iVar9 = 9;
        }
LAB_0011caf7:
        fputc(iVar9,__stream);
        writeinfo = writeinfo + 2;
      }
      else if ((cVar6 == '%') && (cVar1 = writeinfo[1], cVar1 != '\0')) {
        if (cVar1 != '{') {
          iVar9 = 0x25;
          __c = 0x25;
          if (cVar1 == '%') goto LAB_0011caf7;
LAB_0011cae3:
          fputc(__c,__stream);
          iVar9 = (int)writeinfo[1];
          goto LAB_0011caf7;
        }
        pcVar7 = strchr(writeinfo,0x7d);
        writeinfo = writeinfo + 2;
        if (pcVar7 == (char *)0x0) {
          fputs("%{",__stream);
        }
        else {
          cVar6 = *pcVar7;
          *pcVar7 = '\0';
          iVar9 = curl_strequal(writeinfo,"content_type");
          if (iVar9 == 0) {
            lVar5 = 0;
            do {
              lVar11 = lVar5;
              lVar4 = *(long *)((long)&variables[1].name + lVar11);
              if (lVar11 + 0x18 == 0x3f0) {
                bVar13 = lVar4 == 0;
                goto LAB_0011cbe7;
              }
              iVar9 = curl_strequal(writeinfo,lVar4);
              lVar5 = lVar11 + 0x18;
            } while (iVar9 == 0);
            bVar13 = lVar4 == 0;
            pwVar10 = (writeoutvar *)(lVar11 + 0x12d958);
          }
          else {
            bVar13 = false;
            pwVar10 = variables;
          }
          wVar3 = pwVar10->id;
          if ((int)wVar3 < 0x26) {
            if (wVar3 == VAR_JSON) {
              ourWriteOutJSON((FILE *)__stream,variables,per,per_result);
            }
            else if (wVar3 == VAR_ONERROR) {
              if (per_result == CURLE_OK) {
                bVar12 = true;
              }
            }
            else {
LAB_0011cbab:
              (*pwVar10->writefunc)((FILE *)__stream,pwVar10,per,per_result,false);
            }
          }
          else {
            if (wVar3 == VAR_STDERR) {
              puVar8 = (undefined8 *)&stderr;
            }
            else {
              if (wVar3 != VAR_STDOUT) goto LAB_0011cbab;
              puVar8 = (undefined8 *)&stdout;
            }
            __stream = (FILE *)*puVar8;
          }
LAB_0011cbe7:
          if (bVar13) {
            curl_mfprintf(_stderr,"curl: unknown --write-out variable: \'%s\'\n",writeinfo);
          }
          writeinfo = pcVar7 + 1;
          *pcVar7 = cVar6;
        }
      }
      else {
LAB_0011cabd:
        fputc((int)cVar6,__stream);
        writeinfo = writeinfo + 1;
      }
      cVar6 = *writeinfo;
    } while ((cVar6 != '\0') && (!bVar12));
  }
  return;
}

Assistant:

void ourWriteOut(const char *writeinfo, struct per_transfer *per,
                 CURLcode per_result)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  bool done = FALSE;

  while(ptr && *ptr && !done) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        if('{' == ptr[1]) {
          char keepit;
          int i;
          bool match = FALSE;
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          keepit = *end;
          *end = 0; /* null-terminate */
          for(i = 0; variables[i].name; i++) {
            if(curl_strequal(ptr, variables[i].name)) {
              match = TRUE;
              switch(variables[i].id) {
              case VAR_ONERROR:
                if(per_result == CURLE_OK)
                  /* this isn't error so skip the rest */
                  done = TRUE;
                break;
              case VAR_STDOUT:
                stream = stdout;
                break;
              case VAR_STDERR:
                stream = stderr;
                break;
              case VAR_JSON:
                ourWriteOutJSON(stream, variables, per, per_result);
                break;
              default:
                (void)variables[i].writefunc(stream, &variables[i],
                                             per, per_result, false);
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }
}